

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_integrate_pdf<trng::chi_square_dist<double>>(chi_square_dist<double> *d)

{
  StringRef capturedExpression;
  longlong *plVar1;
  ExprLhs<const_double_&> expr;
  int __x;
  double dVar2;
  AssertionHandler *this;
  double *extraout_XMM0_Qa;
  AssertionHandler catchAssertionHandler;
  result_type tol;
  result_type s;
  int i;
  vector<double,_std::allocator<double>_> y;
  result_type dx;
  result_type x_max;
  result_type x_min;
  int samples;
  Decomposer *in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  AssertionHandler *this_00;
  chi_square_dist<double> *in_stack_fffffffffffffe98;
  StringRef *macroName;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  double *rhs;
  ExprLhs<const_double_&> *in_stack_fffffffffffffeb8;
  AssertionHandler local_f8;
  double local_90;
  double *local_88;
  double *local_80;
  double local_78;
  chi_square_dist<double> *local_60;
  int local_54;
  StringRef local_50;
  double local_38;
  result_type_conflict2 local_30;
  double local_28;
  long local_20;
  longlong local_18;
  int local_c;
  
  local_18 = 0x100000;
  dVar2 = Catch::clara::std::numeric_limits<double>::epsilon();
  dVar2 = sqrt(dVar2);
  dVar2 = round(1.0 / dVar2);
  local_20 = (long)dVar2;
  plVar1 = std::min<long_long>(&local_18,&local_20);
  local_c = (int)*plVar1;
  local_28 = trng::chi_square_dist<double>::icdf
                       (in_stack_fffffffffffffe98,(result_type_conflict2)in_stack_fffffffffffffe90);
  local_30 = trng::chi_square_dist<double>::icdf
                       (in_stack_fffffffffffffe98,(result_type_conflict2)in_stack_fffffffffffffe90);
  local_38 = (local_30 - local_28) / (double)local_c;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x350d56);
  for (local_54 = 0; local_54 <= local_c; local_54 = local_54 + 1) {
    in_stack_fffffffffffffea8._M_current =
         (double *)
         trng::chi_square_dist<double>::pdf
                   (in_stack_fffffffffffffea8._M_current,in_stack_fffffffffffffea0._M_current);
    local_60 = (chi_square_dist<double> *)in_stack_fffffffffffffea8._M_current;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffe90,(value_type_conflict6 *)in_stack_fffffffffffffe88);
  }
  macroName = &local_50;
  local_80 = (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  local_88 = (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe88);
  this = (AssertionHandler *)
         simpson_int<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                   (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  local_78 = (double)this * local_38;
  local_90 = (64.0 / (double)local_c) / (double)local_c;
  local_f8.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  this_00 = &local_f8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x94);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  __x = (int)&local_f8 + 0x20;
  capturedExpression.m_size = in_stack_fffffffffffffeb0;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffea8._M_current;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffe88 >> 0x20));
  Catch::clara::std::abs(__x);
  rhs = extraout_XMM0_Qa;
  expr = Catch::Decomposer::operator<=(in_stack_fffffffffffffe88,(double *)0x350f3b);
  Catch::ExprLhs<double_const&>::operator<(in_stack_fffffffffffffeb8,rhs);
  Catch::AssertionHandler::handleExpr(this_00,(ITransientExpression *)expr.m_lhs);
  Catch::BinaryExpr<const_double_&,_const_double_&>::~BinaryExpr
            ((BinaryExpr<const_double_&,_const_double_&> *)0x350f81);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}